

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void tcache_flush_cache(tsd_t *tsd,tcache_t *tcache)

{
  tcache_slow_t *ptVar1;
  ulong uVar2;
  cache_bin_t *cache_bin;
  
  ptVar1 = tcache->tcache_slow;
  if (ptVar1->tcache_nbins != 0) {
    cache_bin = tcache->bins;
    uVar2 = 0;
    do {
      if (cache_bin->stack_head != (void **)&duckdb_je_disabled_bin) {
        if (uVar2 < 0x24) {
          duckdb_je_tcache_bin_flush_small(tsd,tcache,cache_bin,(szind_t)uVar2,0);
        }
        else {
          duckdb_je_tcache_bin_flush_large(tsd,tcache,cache_bin,(szind_t)uVar2,0);
        }
      }
      uVar2 = uVar2 + 1;
      cache_bin = cache_bin + 1;
    } while (uVar2 < ptVar1->tcache_nbins);
  }
  return;
}

Assistant:

static void
tcache_flush_cache(tsd_t *tsd, tcache_t *tcache) {
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	assert(tcache_slow->arena != NULL);

	for (unsigned i = 0; i < tcache_nbins_get(tcache_slow); i++) {
		cache_bin_t *cache_bin = &tcache->bins[i];
		if (tcache_bin_disabled(i, cache_bin, tcache_slow)) {
			continue;
		}
		if (i < SC_NBINS) {
			tcache_bin_flush_small(tsd, tcache, cache_bin, i, 0);
		} else {
			tcache_bin_flush_large(tsd, tcache, cache_bin, i, 0);
		}
		if (config_stats) {
			assert(cache_bin->tstats.nrequests == 0);
		}
	}
}